

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::LogDestination::DeleteLogDestinations(void)

{
  vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *__ptr;
  int iVar1;
  long lVar2;
  unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *log_destination;
  
  lVar2 = 0;
  do {
    std::__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_>::
    reset((__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> *)
          ((long)&log_destinations_ + lVar2),(pointer)0x0);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x20);
  iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)sink_mutex_);
  __ptr = sinks_;
  if (iVar1 != 0x23) {
    sinks_ = (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0;
    if (__ptr != (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0) {
      std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>::
      operator()((default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
                  *)&sinks_,__ptr);
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)sink_mutex_);
    return;
  }
  std::__throw_system_error(0x23);
}

Assistant:

void LogDestination::DeleteLogDestinations() {
  for (auto& log_destination : log_destinations_) {
    log_destination.reset();
  }
  SinkLock l{sink_mutex_};
  sinks_.reset();
}